

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

bool __thiscall AmpIO::SetAmpEnable(AmpIO *this,uint index,bool state)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = this->NumMotors;
  if (index < uVar1) {
    uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    if (uVar2 < 8) {
      uVar3 = 1 << ((byte)index & 0x1f);
      this->WriteBuffer[this->WB_CTRL_OFFSET] =
           this->WriteBuffer[this->WB_CTRL_OFFSET] | 0x100 << ((byte)index & 0x1f);
      if (state) {
        this->WriteBuffer[this->WB_CTRL_OFFSET] = this->WriteBuffer[this->WB_CTRL_OFFSET] | uVar3;
      }
      else {
        this->WriteBuffer[this->WB_CTRL_OFFSET] = this->WriteBuffer[this->WB_CTRL_OFFSET] & ~uVar3;
      }
    }
    else {
      this->WriteBuffer[this->WB_CURR_OFFSET + index] =
           this->WriteBuffer[this->WB_CURR_OFFSET + index] | 0x20000000;
      uVar3 = this->WB_CURR_OFFSET + index;
      if (state) {
        uVar4 = this->WriteBuffer[uVar3] | 0x10000000;
      }
      else {
        uVar4 = this->WriteBuffer[uVar3] & 0xefffffff;
      }
      this->WriteBuffer[uVar3] = uVar4;
    }
  }
  return index < uVar1;
}

Assistant:

bool AmpIO::SetAmpEnable(unsigned int index, bool state)
{
    if (index >= NumMotors)
        return false;

    if (GetFirmwareVersion() < 8) {
        uint32_t enable_mask = 0x00000100 << index;
        uint32_t state_mask  = 0x00000001 << index;
        WriteBuffer[WB_CTRL_OFFSET] |=  enable_mask;
        if (state)
            WriteBuffer[WB_CTRL_OFFSET] |=  state_mask;
        else
            WriteBuffer[WB_CTRL_OFFSET] &= ~state_mask;
    }
    else {
        WriteBuffer[WB_CURR_OFFSET + index] |=  MOTOR_ENABLE_MASK;
        if (state)
            WriteBuffer[WB_CURR_OFFSET + index] |=  MOTOR_ENABLE_BIT;
        else
            WriteBuffer[WB_CURR_OFFSET + index] &= ~MOTOR_ENABLE_BIT;
    }
    return true;
}